

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

bool __thiscall QVariant::convert(QVariant *this,QMetaType targetType)

{
  QMetaType toType;
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  void *to;
  anon_union_24_3_e3d07ef4_for_data *this_00;
  long in_FS_OFFSET;
  QMetaType local_68;
  QMetaType local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.shared = (PrivateShared *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  local_60.d_ptr = targetType.d_ptr;
  bVar2 = ::comparesEqual((QMetaType *)&local_58.shared,&local_60);
  if (bVar2) {
    bVar2 = local_60.d_ptr != (QMetaTypeInterface *)0x0;
    goto LAB_002a4502;
  }
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVariant((QVariant *)&local_58,this);
  clear(this);
  create(this,local_60,(void *)0x0);
  this_00 = &local_58;
  bVar2 = canConvert((QVariant *)this_00,local_60);
  if (bVar2) {
    if (((ulong)puStack_40 & 2) != 0) {
      local_68.d_ptr = (QMetaTypeInterface *)((ulong)puStack_40 & 0xfffffffffffffffc);
      iVar3 = QMetaType::registerHelper(&local_68);
      if (iVar3 != 0x33) goto LAB_002a44f6;
    }
    puVar1 = puStack_40;
    toType.d_ptr = local_60.d_ptr;
    if (((ulong)puStack_40 & 1) != 0) {
      this_00 = (anon_union_24_3_e3d07ef4_for_data *)
                ((long)&((local_58.shared)->ref).super_QAtomicInteger<int>.
                        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
                (long)(local_58.shared)->offset);
    }
    to = data(this);
    bVar2 = QMetaType::convert((QMetaTypeInterface *)((ulong)puVar1 & 0xfffffffffffffffc),this_00,
                               toType,to);
    *(ulong *)&(this->d).field_0x18 =
         (*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffd) + (ulong)!bVar2 * 2;
  }
  else {
LAB_002a44f6:
    bVar2 = false;
  }
  ~QVariant((QVariant *)&local_58);
LAB_002a4502:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QVariant::convert(QMetaType targetType)
{
    if (d.type() == targetType)
        return targetType.isValid();

    QVariant oldValue = *this;

    clear();
    create(targetType, nullptr);
    if (!oldValue.canConvert(targetType))
        return false;

    // Fail if the value is not initialized or was forced null by a previous failed convert.
    if (oldValue.d.is_null && oldValue.d.type().id() != QMetaType::Nullptr)
        return false;

    bool ok = QMetaType::convert(oldValue.d.type(), oldValue.constData(), targetType, data());
    d.is_null = !ok;
    return ok;
}